

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O3

void __thiscall
cbtDbvt::collideTVNoStackAlloc
          (cbtDbvt *this,cbtDbvtNode *root,cbtDbvtVolume *vol,cbtNodeStack *stack,ICollide *policy)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  cbtDbvtNode *pcVar7;
  int iVar8;
  uint uVar9;
  cbtDbvtNode **ppcVar10;
  uint uVar11;
  ulong uVar12;
  int i;
  long lVar13;
  int iVar14;
  uint uVar15;
  
  if (root != (cbtDbvtNode *)0x0) {
    fVar1 = (vol->mi).m_floats[0];
    fVar2 = (vol->mi).m_floats[1];
    fVar3 = (vol->mi).m_floats[2];
    fVar4 = (vol->mx).m_floats[0];
    fVar5 = (vol->mx).m_floats[1];
    fVar6 = (vol->mx).m_floats[2];
    lVar13 = (long)stack->m_size;
    iVar14 = stack->m_capacity;
    if (lVar13 < 0) {
      if (iVar14 < 0) {
        if ((stack->m_data != (cbtDbvtNode **)0x0) && (stack->m_ownsMemory == true)) {
          cbtAlignedFreeInternal(stack->m_data);
        }
        stack->m_ownsMemory = true;
        stack->m_data = (cbtDbvtNode **)0x0;
        iVar14 = 0;
        stack->m_capacity = 0;
      }
      do {
        stack->m_data[lVar13] = (cbtDbvtNode *)0x0;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0);
    }
    stack->m_size = 0;
    iVar8 = 0;
    if (iVar14 < 0x40) {
      ppcVar10 = (cbtDbvtNode **)cbtAlignedAllocInternal(0x200,0x10);
      iVar8 = stack->m_size;
      if (0 < (long)iVar8) {
        lVar13 = 0;
        do {
          ppcVar10[lVar13] = stack->m_data[lVar13];
          lVar13 = lVar13 + 1;
        } while (iVar8 != lVar13);
      }
      if ((stack->m_data != (cbtDbvtNode **)0x0) && (stack->m_ownsMemory == true)) {
        cbtAlignedFreeInternal(stack->m_data);
        iVar8 = stack->m_size;
      }
      iVar14 = 0x40;
      stack->m_ownsMemory = true;
      stack->m_data = ppcVar10;
      stack->m_capacity = 0x40;
    }
    if (iVar8 == iVar14) {
      ppcVar10 = (cbtDbvtNode **)cbtAlignedAllocInternal((ulong)(uint)(iVar14 * 2) * 8,0x10);
      iVar8 = stack->m_size;
      if (0 < (long)iVar8) {
        lVar13 = 0;
        do {
          ppcVar10[lVar13] = stack->m_data[lVar13];
          lVar13 = lVar13 + 1;
        } while (iVar8 != lVar13);
      }
      if ((stack->m_data != (cbtDbvtNode **)0x0) && (stack->m_ownsMemory == true)) {
        cbtAlignedFreeInternal(stack->m_data);
        iVar8 = stack->m_size;
      }
      stack->m_ownsMemory = true;
      stack->m_data = ppcVar10;
      stack->m_capacity = iVar14 * 2;
    }
    stack->m_data[iVar8] = root;
    uVar11 = iVar8 + 1;
    do {
      ppcVar10 = stack->m_data;
      uVar9 = uVar11 - 1;
      pcVar7 = ppcVar10[(long)(int)uVar11 + -1];
      stack->m_size = uVar9;
      if ((((((pcVar7->volume).mi.m_floats[0] <= fVar4) &&
            (fVar1 <= (pcVar7->volume).mx.m_floats[0])) &&
           ((pcVar7->volume).mi.m_floats[1] <= fVar5)) &&
          ((fVar2 <= (pcVar7->volume).mx.m_floats[1] && ((pcVar7->volume).mi.m_floats[2] <= fVar6)))
          ) && (fVar3 <= (pcVar7->volume).mx.m_floats[2])) {
        if ((pcVar7->field_2).childs[1] == (cbtDbvtNode *)0x0) {
          (*policy->_vptr_ICollide[3])(policy,pcVar7);
          uVar9 = stack->m_size;
        }
        else {
          uVar15 = stack->m_capacity;
          lVar13 = (long)(int)uVar11 + -1;
          if (uVar9 == uVar15) {
            uVar15 = uVar9 * 2;
            if (uVar9 == 0) {
              uVar15 = 1;
            }
            if ((int)uVar11 <= (int)uVar15) {
              if (uVar15 == 0) {
                ppcVar10 = (cbtDbvtNode **)0x0;
              }
              else {
                ppcVar10 = (cbtDbvtNode **)cbtAlignedAllocInternal((long)(int)uVar15 << 3,0x10);
                uVar9 = stack->m_size;
              }
              if (0 < (int)uVar9) {
                uVar12 = 0;
                do {
                  ppcVar10[uVar12] = stack->m_data[uVar12];
                  uVar12 = uVar12 + 1;
                } while (uVar9 != uVar12);
              }
              if ((stack->m_data != (cbtDbvtNode **)0x0) && (stack->m_ownsMemory == true)) {
                cbtAlignedFreeInternal(stack->m_data);
                uVar9 = stack->m_size;
              }
              lVar13 = (long)(int)uVar9;
              stack->m_ownsMemory = true;
              stack->m_data = ppcVar10;
              stack->m_capacity = uVar15;
              uVar11 = uVar9 + 1;
              goto LAB_008b909d;
            }
            ppcVar10[lVar13] = (pcVar7->field_2).childs[0];
          }
          else {
LAB_008b909d:
            ppcVar10[lVar13] = (pcVar7->field_2).childs[0];
            stack->m_size = uVar11;
            if (uVar11 == uVar15) {
              iVar14 = uVar15 * 2;
              if (uVar15 == 0) {
                iVar14 = 1;
              }
              uVar11 = uVar15;
              if ((int)uVar15 < iVar14) {
                if (iVar14 == 0) {
                  ppcVar10 = (cbtDbvtNode **)0x0;
                }
                else {
                  ppcVar10 = (cbtDbvtNode **)cbtAlignedAllocInternal((long)iVar14 << 3,0x10);
                  uVar15 = stack->m_size;
                }
                if (0 < (int)uVar15) {
                  uVar12 = 0;
                  do {
                    ppcVar10[uVar12] = stack->m_data[uVar12];
                    uVar12 = uVar12 + 1;
                  } while (uVar15 != uVar12);
                }
                if ((stack->m_data != (cbtDbvtNode **)0x0) && (stack->m_ownsMemory == true)) {
                  cbtAlignedFreeInternal(stack->m_data);
                  uVar15 = stack->m_size;
                }
                stack->m_ownsMemory = true;
                stack->m_data = ppcVar10;
                stack->m_capacity = iVar14;
                uVar11 = uVar15;
              }
            }
          }
          stack->m_data[(int)uVar11] = (pcVar7->field_2).childs[1];
          uVar9 = uVar11 + 1;
          stack->m_size = uVar9;
        }
      }
      uVar11 = uVar9;
    } while (0 < (int)uVar9);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void cbtDbvt::collideTVNoStackAlloc(const cbtDbvtNode* root,
										  const cbtDbvtVolume& vol,
										  cbtNodeStack& stack,
										  DBVT_IPOLICY) const
{
	DBVT_CHECKTYPE
	if (root)
	{
		ATTRIBUTE_ALIGNED16(cbtDbvtVolume)
		volume(vol);
		stack.resize(0);
		stack.reserve(SIMPLE_STACKSIZE);
		stack.push_back(root);
		do
		{
			const cbtDbvtNode* n = stack[stack.size() - 1];
			stack.pop_back();
			if (Intersect(n->volume, volume))
			{
				if (n->isinternal())
				{
					stack.push_back(n->childs[0]);
					stack.push_back(n->childs[1]);
				}
				else
				{
					policy.Process(n);
				}
			}
		} while (stack.size() > 0);
	}
}